

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcEnergyConversionDeviceType::~IfcEnergyConversionDeviceType
          (IfcEnergyConversionDeviceType *this)

{
  ~IfcEnergyConversionDeviceType
            ((IfcEnergyConversionDeviceType *)
             &this[-1].super_IfcDistributionFlowElementType.super_IfcDistributionElementType.
              super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x28);
  return;
}

Assistant:

IfcEnergyConversionDeviceType() : Object("IfcEnergyConversionDeviceType") {}